

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee754.h
# Opt level: O2

int __thiscall rapidjson::internal::Double::IntegerExponent(Double *this)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = (this->field_0).u_;
  iVar3 = ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x433;
  iVar2 = -0x432;
  if ((uVar1 & 0xfffffffffffff) == 0) {
    iVar2 = iVar3;
  }
  if ((uVar1 & 0x7ff0000000000000) != 0) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

bool IsNormal() const { return (u_ & kExponentMask) != 0 || Significand() == 0; }